

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

void __thiscall pfederc::Lexer::skipSpace(Lexer *this)

{
  while (((ulong)(uint)this->currentChar < 0x21 &&
         ((0x100000a00U >> ((ulong)(uint)this->currentChar & 0x3f) & 1) != 0))) {
    nextChar(this);
  }
  return;
}

Assistant:

void Lexer::skipSpace() noexcept {
  while (currentChar == ' ' || currentChar == '\t' || currentChar == '\v')
    nextChar();
}